

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O3

void __thiscall
Equality_unitsEqualAllTestedConditionsVariant2_Test::
~Equality_unitsEqualAllTestedConditionsVariant2_Test
          (Equality_unitsEqualAllTestedConditionsVariant2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, unitsEqualAllTestedConditionsVariant2)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    libcellml::ImportSourcePtr is = libcellml::ImportSource::create();

    u1->setImportReference("some_location");
    u2->setImportReference("some_location");

    u1->setSourceUnits(is, "ampere");
    u2->setSourceUnits(is, "ampere");

    u1->addUnit("second", 1.0, "unit_id");
    u2->addUnit("second", 1.0, "unit_id");

    EXPECT_TRUE(u1->equals(u2));
    EXPECT_TRUE(u2->equals(u1));
}